

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadModule(BinaryReader *this,ReadModuleOptions *options)

{
  bool bVar1;
  Result result;
  ReadSectionsOptions local_3d;
  Enum local_3c;
  Enum local_38;
  Enum local_34;
  Enum local_30;
  uint16_t local_2c;
  uint16_t local_2a;
  Enum local_28;
  uint16_t layer;
  uint16_t version;
  ReadModuleOptions *pRStack_20;
  uint32_t magic;
  ReadModuleOptions *options_local;
  BinaryReader *this_local;
  
  _layer = 0;
  pRStack_20 = options;
  options_local = (ReadModuleOptions *)this;
  local_28 = (Enum)ReadU32(this,(uint32_t *)&layer,"magic");
  bVar1 = Failed((Result)local_28);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (_layer == 0x6d736100) {
    local_2a = 0;
    local_2c = 0;
    local_30 = (Enum)ReadU16(this,&local_2a,"version");
    bVar1 = Failed((Result)local_30);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_34 = (Enum)ReadU16(this,&local_2c,"layer");
      bVar1 = Failed((Result)local_34);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_2c == 0) {
        if (local_2a == 1) {
          local_38 = (*this->delegate_->_vptr_BinaryReaderDelegate[4])(this->delegate_,1);
          bVar1 = Succeeded((Result)local_38);
          if (bVar1) {
            local_3d.stop_on_first_error = (bool)(pRStack_20->stop_on_first_error & 1);
            local_3c = (Enum)ReadSections(this,&local_3d);
            bVar1 = Failed((Result)local_3c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else if (this->num_function_signatures_ == this->num_function_bodies_) {
              if (((this->num_data_segments_ == 0) && (this->data_count_ != 0xffffffff)) &&
                 (this->data_count_ != 0)) {
                PrintError(this,"Data section missing but DataCount non-zero");
                Result::Result((Result *)((long)&this_local + 4),Error);
              }
              else {
                result.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[5])();
                bVar1 = Succeeded(result);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Ok);
                }
                else {
                  PrintError(this,"EndModule callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                }
              }
            }
            else {
              PrintError(this,"function signature count != function body count");
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
          }
          else {
            PrintError(this,"BeginModule callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"bad wasm file version: %#x (expected %#x)",(ulong)local_2a,1);
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else if (local_2c == 1) {
        PrintError(this,"wasm components are not yet supported in this tool");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        PrintError(this,"unsupported wasm layer: %#x",(ulong)local_2c);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"bad magic value");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadModule(const ReadModuleOptions& options) {
  uint32_t magic = 0;
  CHECK_RESULT(ReadU32(&magic, "magic"));
  ERROR_UNLESS(magic == WABT_BINARY_MAGIC, "bad magic value");

  uint16_t version = 0, layer = 0;
  CHECK_RESULT(ReadU16(&version, "version"));
  CHECK_RESULT(ReadU16(&layer, "layer"));

  switch (layer) {
    case WABT_BINARY_LAYER_MODULE:
      ERROR_UNLESS(version == WABT_BINARY_VERSION,
                   "bad wasm file version: %#x (expected %#x)", version,
                   WABT_BINARY_VERSION);
      break;
    case WABT_BINARY_LAYER_COMPONENT:
      ERROR("wasm components are not yet supported in this tool");
      break;
    default:
      ERROR("unsupported wasm layer: %#x", layer);
      break;
  }

  CALLBACK(BeginModule, version);
  CHECK_RESULT(ReadSections(ReadSectionsOptions{options.stop_on_first_error}));
  // This is checked in ReadCodeSection, but it must be checked at the end too,
  // in case the code section was omitted.
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  // This is checked in ReadDataSection, but it must be checked at the end too,
  // in case the data section was omitted.
  ERROR_IF(num_data_segments_ == 0 && data_count_ != kInvalidIndex &&
               data_count_ != 0,
           "Data section missing but DataCount non-zero");
  CALLBACK0(EndModule);

  return Result::Ok;
}